

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool IsRootOfOpenMenuSet(void)

{
  ImGuiPopupData *pIVar1;
  ImGuiPopupData *upper_popup;
  ImGuiWindow *window;
  ImGuiContext *g;
  bool local_21;
  bool local_1;
  
  if (((GImGui->BeginPopupStack).Size < (GImGui->OpenPopupStack).Size) &&
     ((GImGui->CurrentWindow->Flags & 0x10000000U) == 0)) {
    pIVar1 = ImVector<ImGuiPopupData>::operator[]
                       (&GImGui->OpenPopupStack,(GImGui->BeginPopupStack).Size);
    local_21 = false;
    if (pIVar1->Window != (ImGuiWindow *)0x0) {
      local_21 = (pIVar1->Window->Flags & 0x10000000U) != 0;
    }
    local_1 = local_21;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool IsRootOfOpenMenuSet()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if ((g.OpenPopupStack.Size <= g.BeginPopupStack.Size) || (window->Flags & ImGuiWindowFlags_ChildMenu))
        return false;

    // Initially we used 'OpenParentId' to differentiate multiple menu sets from each others (e.g. inside menu bar vs loose menu items) based on parent ID.
    // This would however prevent the use of e.g. PuhsID() user code submitting menus.
    // Previously this worked between popup and a first child menu because the first child menu always had the _ChildWindow flag,
    // making  hovering on parent popup possible while first child menu was focused - but this was generally a bug with other side effects.
    // Instead we don't treat Popup specifically (in order to consistently support menu features in them), maybe the first child menu of a Popup
    // doesn't have the _ChildWindow flag, and we rely on this IsRootOfOpenMenuSet() check to allow hovering between root window/popup and first chilld menu.
    const ImGuiPopupData* upper_popup = &g.OpenPopupStack[g.BeginPopupStack.Size];
    return (/*upper_popup->OpenParentId == window->IDStack.back() &&*/ upper_popup->Window && (upper_popup->Window->Flags & ImGuiWindowFlags_ChildMenu));
}